

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5DataWrite(Fts5Index *p,i64 iRowid,u8 *pData,int nData)

{
  int iVar1;
  char *zSql;
  sqlite3_stmt *pStmt;
  
  if (p->rc != 0) {
    return;
  }
  pStmt = p->pWriter;
  if (pStmt == (sqlite3_stmt *)0x0) {
    zSql = sqlite3_mprintf("REPLACE INTO \'%q\'.\'%q_data\'(id, block) VALUES(?,?)",p->pConfig->zDb,
                           p->pConfig->zName);
    fts5IndexPrepareStmt(p,&p->pWriter,zSql);
    if (p->rc != 0) {
      return;
    }
    pStmt = p->pWriter;
  }
  sqlite3_bind_int64(pStmt,1,iRowid);
  sqlite3_bind_blob(p->pWriter,2,pData,nData,(_func_void_void_ptr *)0x0);
  sqlite3_step(p->pWriter);
  iVar1 = sqlite3_reset(p->pWriter);
  p->rc = iVar1;
  sqlite3_bind_null(p->pWriter,2);
  return;
}

Assistant:

static void fts5DataWrite(Fts5Index *p, i64 iRowid, const u8 *pData, int nData){
  if( p->rc!=SQLITE_OK ) return;

  if( p->pWriter==0 ){
    Fts5Config *pConfig = p->pConfig;
    fts5IndexPrepareStmt(p, &p->pWriter, sqlite3_mprintf(
          "REPLACE INTO '%q'.'%q_data'(id, block) VALUES(?,?)", 
          pConfig->zDb, pConfig->zName
    ));
    if( p->rc ) return;
  }

  sqlite3_bind_int64(p->pWriter, 1, iRowid);
  sqlite3_bind_blob(p->pWriter, 2, pData, nData, SQLITE_STATIC);
  sqlite3_step(p->pWriter);
  p->rc = sqlite3_reset(p->pWriter);
  sqlite3_bind_null(p->pWriter, 2);
}